

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O1

bool makePattern(CHAR8 *textPattern,vector<unsigned_char,_std::allocator<unsigned_char>_> *pattern,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *patternMask)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  ulong __new_size;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  
  sVar4 = strlen(textPattern);
  if ((sVar4 & 1) == 0 && sVar4 != 0) {
    __new_size = sVar4 >> 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(pattern,__new_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(patternMask,__new_size);
    bVar8 = false;
    uVar6 = 1;
    do {
      iVar3 = toupper((int)textPattern[uVar6 * 2 + -2]);
      cVar2 = (char)iVar3;
      if ((byte)(cVar2 - 0x30U) < 10) {
        uVar7 = (int)cVar2 - 0x30;
      }
      else if ((byte)(cVar2 + 0xbfU) < 6) {
        uVar7 = (int)cVar2 - 0x37;
      }
      else {
        uVar7 = ~(uint)(cVar2 == '.');
      }
      iVar3 = toupper((int)textPattern[uVar6 * 2 + -1]);
      cVar2 = (char)iVar3;
      if ((byte)(cVar2 - 0x30U) < 10) {
        uVar5 = (int)cVar2 - 0x30;
      }
      else if ((byte)(cVar2 + 0xbfU) < 6) {
        uVar5 = (int)cVar2 - 0x37;
      }
      else {
        uVar5 = ~(uint)(cVar2 == '.');
      }
      if (uVar7 == 0xffffffff) {
        return bVar8;
      }
      if (uVar5 == 0xffffffff) {
        return bVar8;
      }
      if (uVar7 != 0xfffffffe) {
        (patternMask->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar6 - 1] = 0xf0;
        (pattern->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar6 - 1] = (char)uVar7 << 4;
      }
      if (uVar5 != 0xfffffffe) {
        pbVar1 = (patternMask->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start + (uVar6 - 1);
        *pbVar1 = *pbVar1 | 0xf;
        pbVar1 = (pattern->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start + (uVar6 - 1);
        *pbVar1 = *pbVar1 | (byte)uVar5;
      }
      bVar8 = __new_size <= uVar6;
      bVar9 = uVar6 != __new_size;
      uVar6 = uVar6 + 1;
    } while (bVar9);
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool makePattern(const CHAR8 *textPattern, std::vector<UINT8> &pattern, std::vector<UINT8> &patternMask)
{
    UINTN len = std::strlen(textPattern);
    
    if (len == 0 || len % 2 != 0)
        return false;
    
    len /= 2;
    
    pattern.resize(len);
    patternMask.resize(len);
    
    for (UINTN i = 0; i < len; i++) {
        int v1 = char2hex(std::toupper(textPattern[i * 2]));
        int v2 = char2hex(std::toupper(textPattern[i * 2 + 1]));
        
        if (v1 == -1 || v2 == -1)
            return false;
        
        if (v1 != -2) {
            patternMask[i] = 0xF0;
            pattern[i] = static_cast<UINT8>(v1) << 4;
        }
        
        if (v2 != -2) {
            patternMask[i] |= 0x0F;
            pattern[i] |= static_cast<UINT8>(v2);
        }
    }
    
    return true;
}